

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O0

uchar * InstructionSet::x86::
        register_<unsigned_char,(InstructionSet::x86::AccessType)1,(InstructionSet::x86::Source)9,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                  (Context *context)

{
  Context *context_local;
  
  return (uchar *)0x0;
}

Assistant:

IntT *register_(ContextT &context) {
	static constexpr bool supports_dword = is_32bit(ContextT::model);

	switch(source) {
		case Source::eAX:
			// Slightly contorted if chain here and below:
			//
			//	(i) does the `constexpr` version of a `switch`; and
			//	(i) ensures .eax() etc aren't called on @c registers for 16-bit processors, so they need not implement 32-bit storage.
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.eax();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.ax();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.al();		}
			else 																{	return nullptr;						}
		case Source::eCX:
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.ecx();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.cx();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.cl();		}
			else 																{	return nullptr;						}
		case Source::eDX:
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.edx();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.dx();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.dl();		}
			else if constexpr (std::is_same_v<IntT, uint32_t>)					{	return nullptr;						}
		case Source::eBX:
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.ebx();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.bx();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.bl();		}
			else if constexpr (std::is_same_v<IntT, uint32_t>)					{	return nullptr;						}
		case Source::eSPorAH:
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.esp();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.sp();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.ah();		}
			else																{	return nullptr;						}
		case Source::eBPorCH:
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.ebp();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.bp();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.ch();		}
			else 																{	return nullptr;						}
		case Source::eSIorDH:
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.esi();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.si();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.dh();		}
			else 																{	return nullptr;						}
		case Source::eDIorBH:
			if constexpr (supports_dword && std::is_same_v<IntT, uint32_t>) 	{	return &context.registers.edi();	}
			else if constexpr (std::is_same_v<IntT, uint16_t>)					{	return &context.registers.di();		}
			else if constexpr (std::is_same_v<IntT, uint8_t>)					{	return &context.registers.bh();		}
			else																{	return nullptr;						}

		// Segment registers are always 16-bit.
		case Source::ES:	if constexpr (std::is_same_v<IntT, uint16_t>) return &context.registers.es(); else return nullptr;
		case Source::CS:	if constexpr (std::is_same_v<IntT, uint16_t>) return &context.registers.cs(); else return nullptr;
		case Source::SS:	if constexpr (std::is_same_v<IntT, uint16_t>) return &context.registers.ss(); else return nullptr;
		case Source::DS:	if constexpr (std::is_same_v<IntT, uint16_t>) return &context.registers.ds(); else return nullptr;

		// 16-bit models don't have FS and GS.
		case Source::FS:	if constexpr (is_32bit(ContextT::model) && std::is_same_v<IntT, uint16_t>) return &context.registers.fs(); else return nullptr;
		case Source::GS:	if constexpr (is_32bit(ContextT::model) && std::is_same_v<IntT, uint16_t>) return &context.registers.gs(); else return nullptr;

		default: return nullptr;
	}
}